

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

void __thiscall toml::detail::syntax::key::key(key *this,spec *s)

{
  either *in_RDI;
  spec *in_stack_00000048;
  either *in_stack_ffffffffffffffb0;
  sequence *in_stack_ffffffffffffffb8;
  either *in_stack_ffffffffffffffc0;
  spec *in_stack_ffffffffffffffe8;
  
  scanner_base::scanner_base(&in_RDI->super_scanner_base);
  (in_RDI->super_scanner_base)._vptr_scanner_base = (_func_int **)&PTR__key_00a5f840;
  dotted_key(in_stack_00000048);
  simple_key(in_stack_ffffffffffffffe8);
  either::either<toml::detail::sequence,toml::detail::either>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  either::~either(in_RDI);
  sequence::~sequence((sequence *)in_RDI);
  return;
}

Assistant:

TOML11_INLINE key::key(const spec& s) noexcept
    : scanner_(dotted_key(s), simple_key(s))
{}